

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyFileCreatorFactory.cpp
# Opt level: O1

void ApprovalTests::EmptyFileCreatorFactory::defaultCreator(string *fullFilePath)

{
  pointer pcVar1;
  size_t in_RCX;
  void *__buf;
  char *__end;
  StringWriter s;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  string local_a8;
  string local_88;
  StringWriter local_68;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"","");
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"","");
  StringWriter::StringWriter(&local_68,&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  pcVar1 = (fullFilePath->_M_dataplus)._M_p;
  local_c8[0] = local_b8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,pcVar1 + fullFilePath->_M_string_length);
  StringWriter::write(&local_68,(int)local_c8,__buf,in_RCX);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  local_68.super_ApprovalWriter._vptr_ApprovalWriter = (_func_int **)&PTR__StringWriter_00163950;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.ext._M_dataplus._M_p != &local_68.ext.field_2) {
    operator_delete(local_68.ext._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.s._M_dataplus._M_p != &local_68.s.field_2) {
    operator_delete(local_68.s._M_dataplus._M_p);
  }
  return;
}

Assistant:

void EmptyFileCreatorFactory::defaultCreator(std::string fullFilePath)
    {
        StringWriter s("", "");
        s.write(fullFilePath);
    }